

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
llvm::SmallVectorImpl<char>::append(SmallVectorImpl<char> *this,size_type NumInputs,char *Elt)

{
  void *pvVar1;
  size_t sVar2;
  size_t sVar3;
  char *Elt_local;
  size_type NumInputs_local;
  SmallVectorImpl<char> *this_local;
  
  sVar2 = SmallVectorBase::capacity((SmallVectorBase *)this);
  sVar3 = SmallVectorBase::size((SmallVectorBase *)this);
  if (sVar2 - sVar3 < NumInputs) {
    sVar2 = SmallVectorBase::size((SmallVectorBase *)this);
    SmallVectorTemplateBase<char,_true>::grow
              (&this->super_SmallVectorTemplateBase<char,_true>,sVar2 + NumInputs);
  }
  pvVar1 = (this->super_SmallVectorTemplateBase<char,_true>).
           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
  sVar2 = SmallVectorBase::size((SmallVectorBase *)this);
  std::uninitialized_fill_n<char*,unsigned_long,char>((char *)((long)pvVar1 + sVar2),NumInputs,Elt);
  sVar2 = SmallVectorBase::size((SmallVectorBase *)this);
  SmallVectorBase::set_size((SmallVectorBase *)this,sVar2 + NumInputs);
  return;
}

Assistant:

void append(size_type NumInputs, const T &Elt) {
    // Grow allocated space if needed.
    if (NumInputs > this->capacity() - this->size())
      this->grow(this->size()+NumInputs);

    // Copy the new elements over.
    std::uninitialized_fill_n(this->end(), NumInputs, Elt);
    this->set_size(this->size() + NumInputs);
  }